

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_PluginTest_DisablesPluginsDontRun_TestShell::~TEST_PluginTest_DisablesPluginsDontRun_TestShell
          (TEST_PluginTest_DisablesPluginsDontRun_TestShell *this)

{
  TEST_PluginTest_DisablesPluginsDontRun_TestShell *this_local;
  
  ~TEST_PluginTest_DisablesPluginsDontRun_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(PluginTest, DisablesPluginsDontRun)
{
    registry->installPlugin(thirdPlugin);
    thirdPlugin->disable();
    genFixture->runAllTests();
    CHECK(!thirdPlugin->isEnabled());
    thirdPlugin->enable();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(1, thirdPlugin->preAction);
    CHECK(thirdPlugin->isEnabled());
}